

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ascii.cc
# Opt level: O2

void absl::ascii_internal::AsciiStrCaseFoldLong<true>
               (Nonnull<char_*> dst,Nonnull<const_char_*> src,size_t size)

{
  size_t i;
  size_t sVar1;
  
  if (0xf < size) {
    for (sVar1 = 0; size != sVar1; sVar1 = sVar1 + 1) {
      dst[sVar1] = ((char)(src[sVar1] + 0x1fU) < -0x66) << 5 ^ src[sVar1];
    }
    return;
  }
  __assert_fail("size >= kCaseFoldThreshold",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/ascii.cc"
                ,0xcd,
                "void absl::ascii_internal::AsciiStrCaseFoldLong(absl::Nonnull<char *>, absl::Nonnull<const char *>, size_t) [ToUpper = true]"
               );
}

Assistant:

ABSL_ATTRIBUTE_NOINLINE constexpr void AsciiStrCaseFoldLong(
    absl::Nonnull<char*> dst, absl::Nonnull<const char*> src, size_t size) {
  ABSL_ASSUME(size >= kCaseFoldThreshold);
  AsciiStrCaseFoldImpl<ToUpper>(dst, src, size);
}